

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O1

void update_stuff(player *p)

{
  uint32_t *puVar1;
  wchar_t *pwVar2;
  bitflag *flags;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  wchar_t wVar6;
  player_upkeep *ppVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  _Bool _Var10;
  _Bool _Var11;
  int iVar12;
  wchar_t wVar13;
  object *poVar14;
  class_spell *pcVar15;
  magic_realm *pmVar16;
  int iVar17;
  ulong uVar18;
  wchar_t wVar19;
  magic_realm *p_00;
  char *pcVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  player_state_conflict state;
  player_state_conflict known_state;
  short local_2b0;
  player_state_conflict local_2a8;
  player_state_conflict local_16c;
  
  uVar5 = p->upkeep->update;
  if (uVar5 == 0) {
    return;
  }
  if ((uVar5 >> 10 & 1) != 0) {
    p->upkeep->update = uVar5 & 0xfffffbff;
    calc_inventory(p);
  }
  uVar5 = p->upkeep->update;
  if ((uVar5 & 1) == 0) goto LAB_001b97a0;
  p->upkeep->update = uVar5 & 0xfffffffe;
  memcpy(&local_2a8,&p->state,0x13c);
  memcpy(&local_16c,&p->known_state,0x13c);
  lVar23 = 0;
  calc_bonuses(p,&local_2a8,false,true);
  calc_bonuses(p,&local_16c,true,true);
  do {
    if (*(int *)((long)local_2a8.stat_top + lVar23) != *(int *)((long)(p->state).stat_top + lVar23))
    {
      puVar1 = &p->upkeep->redraw;
      *puVar1 = *puVar1 | 0x10;
    }
    if (*(int *)((long)local_2a8.stat_use + lVar23) != *(int *)((long)(p->state).stat_use + lVar23))
    {
      puVar1 = &p->upkeep->redraw;
      *puVar1 = *puVar1 | 0x10;
    }
    if (*(int *)((long)local_2a8.stat_ind + lVar23) != *(int *)((long)(p->state).stat_ind + lVar23))
    {
      if (lVar23 == 0x10) {
        puVar1 = &p->upkeep->update;
        *puVar1 = *puVar1 | 4;
      }
      puVar1 = &p->upkeep->update;
      *puVar1 = *puVar1 | 0x18;
    }
    lVar23 = lVar23 + 4;
  } while (lVar23 != 0x14);
  _Var10 = flag_has_dbg(local_2a8.flags,6,0xd,"state.flags","OF_TELEPATHY");
  flags = (p->state).flags;
  _Var11 = flag_has_dbg(flags,6,0xd,"p->state.flags","OF_TELEPATHY");
  if (_Var10 != _Var11) {
    puVar1 = &p->upkeep->update;
    *puVar1 = *puVar1 | 0x80;
  }
  _Var10 = flag_has_dbg(local_2a8.flags,6,0xe,"state.flags","OF_SEE_INVIS");
  _Var11 = flag_has_dbg(flags,6,0xe,"p->state.flags","OF_SEE_INVIS");
  if (_Var10 != _Var11) {
    puVar1 = &p->upkeep->update;
    *puVar1 = *puVar1 | 0x80;
  }
  if (local_2a8.speed != (p->state).speed) {
    puVar1 = &p->upkeep->redraw;
    *puVar1 = *puVar1 | 0x400;
  }
  if ((local_16c.ac != (p->known_state).ac) || (local_16c.to_a != (p->known_state).to_a)) {
    puVar1 = &p->upkeep->redraw;
    *puVar1 = *puVar1 | 0x20;
  }
  if ((p->state).cur_light != local_2a8.cur_light) {
    puVar1 = &p->upkeep->update;
    *puVar1 = *puVar1 | 0xc0;
  }
  if (adj_str_wgt[(p->state).stat_ind[0]] != adj_str_wgt[local_2a8.stat_ind[0]]) {
    puVar1 = &p->upkeep->redraw;
    *puVar1 = *puVar1 | 0x20000;
  }
  if (p->upkeep->only_partial == false) {
    if ((p->state).heavy_shoot != local_2a8.heavy_shoot) {
      if (local_2a8.heavy_shoot == false) {
        poVar14 = equipped_item_by_slot_name(p,"shooting");
        pcVar20 = "You have no trouble wielding your bow.";
        if (poVar14 == (object *)0x0) {
          pcVar20 = "You feel relieved to put down your heavy bow.";
        }
      }
      else {
        pcVar20 = "You have trouble wielding such a heavy bow.";
      }
      msg(pcVar20);
    }
    if ((p->state).heavy_wield != local_2a8.heavy_wield) {
      if (local_2a8.heavy_wield == false) {
        poVar14 = equipped_item_by_slot_name(p,"weapon");
        pcVar20 = "You have no trouble wielding your weapon.";
        if (poVar14 == (object *)0x0) {
          pcVar20 = "You feel relieved to put down your heavy weapon.";
        }
      }
      else {
        pcVar20 = "You have trouble wielding such a heavy weapon.";
      }
      msg(pcVar20);
    }
    if ((p->state).bless_wield != local_2a8.bless_wield) {
      if (local_2a8.bless_wield == false) {
        poVar14 = equipped_item_by_slot_name(p,"weapon");
        if (poVar14 == (object *)0x0) goto LAB_001b9709;
        pcVar20 = "You feel less attuned to your weapon.";
      }
      else {
        pcVar20 = "You feel attuned to your weapon.";
      }
      msg(pcVar20);
    }
LAB_001b9709:
    if ((p->state).cumber_armor != local_2a8.cumber_armor) {
      pcVar20 = "You feel able to move more freely.";
      if (local_2a8.cumber_armor != false) {
        pcVar20 = "The weight of your armor encumbers your movement.";
      }
      msg(pcVar20);
    }
    if (((p->state).shield_on_back != local_2a8.shield_on_back) &&
       (poVar14 = equipped_item_by_slot_name(p,"arm"), poVar14 != (object *)0x0)) {
      pcVar20 = "You are carrying your shield in your hand.";
      if (local_2a8.shield_on_back != false) {
        pcVar20 = "You are carrying your shield on your back.";
      }
      msg(pcVar20);
    }
  }
  memcpy(&p->state,&local_2a8,0x13c);
  memcpy(&p->known_state,&local_16c,0x13c);
LAB_001b97a0:
  uVar5 = p->upkeep->update;
  if ((uVar5 & 2) != 0) {
    p->upkeep->update = uVar5 & 0xfffffffd;
    calc_light(p,&p->state,true);
  }
  uVar5 = p->upkeep->update;
  if ((uVar5 & 4) != 0) {
    p->upkeep->update = uVar5 & 0xfffffffb;
    iVar12 = (int)p->lev;
    auVar9 = SEXT816((long)adj_con_mhp[(p->state).stat_ind[4]] * (long)iVar12) *
             ZEXT816(0xa3d70a3d70a3d70b);
    iVar17 = ((int)(auVar9._8_8_ >> 6) - (auVar9._12_4_ >> 0x1f)) +
             (int)p->player_hp[(long)iVar12 + -1];
    iVar22 = iVar12 + 1;
    if (iVar12 < iVar17) {
      iVar22 = iVar17;
    }
    _Var10 = flag_has_dbg((p->state).pflags,10,0x48,"p->state.pflags","(PF_ATHLETICS)");
    if (_Var10) {
      iVar22 = iVar22 + iVar22 / 0x14;
    }
    if (iVar22 != p->mhp) {
      p->mhp = (int16_t)iVar22;
      if (iVar22 <= p->chp) {
        p->chp = (int16_t)iVar22;
        p->chp_frac = 0;
      }
      puVar1 = &p->upkeep->redraw;
      *puVar1 = *puVar1 | 0x40;
    }
  }
  uVar5 = p->upkeep->update;
  if ((uVar5 & 8) != 0) {
    p->upkeep->update = uVar5 & 0xfffffff7;
    calc_mana(p,&p->state,true);
  }
  ppVar7 = p->upkeep;
  if ((ppVar7->update & 0x10) != 0) {
    ppVar7->update = ppVar7->update & 0xffffffef;
    wVar19 = (p->class->magic).total_spells;
    uVar24 = (ulong)(uint)wVar19;
    if (((L'\0' < wVar19) && (character_generated == true)) && (ppVar7->only_partial == false)) {
      wVar6 = ppVar7->new_spells;
      iVar12 = (int)p->lev - (p->class->magic).spell_first;
      iVar22 = -1;
      if (-1 < iVar12) {
        iVar22 = iVar12;
      }
      wVar13 = average_spell_stat(p,&p->state);
      uVar18 = 0;
      iVar12 = 0;
      do {
        iVar12 = iVar12 + (p->spell_flags[uVar18] & 1);
        uVar18 = uVar18 + 1;
      } while (uVar24 != uVar18);
      p->upkeep->new_spells = ((iVar22 + 1) * adj_mag_study[wVar13] + 0x32) / 100 - iVar12;
      lVar23 = (ulong)(uint)(wVar19 + L'\xffffffff') + 1;
      do {
        bVar3 = p->spell_order[lVar23 + -1];
        if ((bVar3 < 99) && (pcVar15 = spell_by_index(p,(uint)bVar3), (int)p->lev < pcVar15->slevel)
           ) {
          bVar4 = p->spell_flags[bVar3];
          if ((bVar4 & 1) != 0) {
            p->spell_flags[bVar3] = bVar4 | 4;
            p->spell_flags[bVar3] = p->spell_flags[bVar3] & 0xfe;
            msg("You have forgotten the %s of %s.",pcVar15->realm->spell_noun,pcVar15->name);
            pwVar2 = &p->upkeep->new_spells;
            *pwVar2 = *pwVar2 + L'\x01';
          }
        }
        lVar21 = lVar23 + -1;
        bVar8 = 0 < lVar23;
        lVar23 = lVar21;
      } while (lVar21 != 0 && bVar8);
      lVar23 = (ulong)(uint)(wVar19 + L'\xffffffff') + 1;
      do {
        if (L'\xffffffff' < p->upkeep->new_spells) break;
        bVar3 = p->spell_order[lVar23 + -1];
        if (bVar3 < 99) {
          pcVar15 = spell_by_index(p,(uint)bVar3);
          bVar4 = p->spell_flags[bVar3];
          if ((bVar4 & 1) != 0) {
            p->spell_flags[bVar3] = bVar4 | 4;
            p->spell_flags[bVar3] = p->spell_flags[bVar3] & 0xfe;
            msg("You have forgotten the %s of %s.",pcVar15->realm->spell_noun,pcVar15->name);
            pwVar2 = &p->upkeep->new_spells;
            *pwVar2 = *pwVar2 + L'\x01';
          }
        }
        lVar21 = lVar23 + -1;
        bVar8 = 0 < lVar23;
        lVar23 = lVar21;
      } while (lVar21 != 0 && bVar8);
      uVar18 = 0;
      do {
        if (p->upkeep->new_spells < L'\x01') break;
        bVar3 = p->spell_order[uVar18];
        if (0x62 < bVar3) break;
        pcVar15 = spell_by_index(p,(uint)bVar3);
        if (pcVar15->slevel <= (int)p->lev) {
          bVar4 = p->spell_flags[bVar3];
          if ((bVar4 & 4) != 0) {
            p->spell_flags[bVar3] = bVar4 & 0xfb;
            p->spell_flags[bVar3] = p->spell_flags[bVar3] | 1;
            msg("You have remembered the %s of %s.",pcVar15->realm->spell_noun,pcVar15->name);
            pwVar2 = &p->upkeep->new_spells;
            *pwVar2 = *pwVar2 + L'\xffffffff';
          }
        }
        uVar18 = uVar18 + 1;
      } while (uVar24 != uVar18);
      uVar18 = 0;
      wVar19 = L'\0';
      do {
        pcVar15 = spell_by_index(p,(wchar_t)uVar18);
        if (((pcVar15 != (class_spell *)0x0) && (pcVar15->slevel != L'\0')) &&
           (pcVar15->slevel <= (int)p->lev)) {
          wVar19 = wVar19 + (~(uint)p->spell_flags[uVar18] & 1);
        }
        uVar18 = uVar18 + 1;
      } while (uVar24 != uVar18);
      ppVar7 = p->upkeep;
      if (wVar19 < ppVar7->new_spells) {
        ppVar7->new_spells = wVar19;
      }
      local_2b0 = (short)wVar6;
      if ((int)local_2b0 != ppVar7->new_spells) {
        if (ppVar7->new_spells != L'\0') {
          pmVar16 = class_magic_realms(p->class,local_16c.stat_add);
          my_strcpy((char *)&local_2a8,pmVar16->spell_noun,0x78);
          if (L'\x01' < p->upkeep->new_spells) {
            my_strcat((char *)&local_2a8,"s",0x78);
          }
          p_00 = pmVar16->next;
          mem_free(pmVar16);
          if (p_00 != (magic_realm *)0x0 && 1 < local_16c.stat_add[0]) {
            do {
              local_16c.stat_add[0] = local_16c.stat_add[0] + -1;
              pcVar20 = " or ";
              if (local_16c.stat_add[0] != 0) {
                pcVar20 = ", ";
              }
              my_strcat((char *)&local_2a8,pcVar20,0x78);
              my_strcat((char *)&local_2a8,p_00->spell_noun,0x78);
              if (L'\x01' < p->upkeep->new_spells) {
                my_strcat((char *)&local_2a8,"s",0x78);
              }
              pmVar16 = p_00->next;
              mem_free(p_00);
              p_00 = pmVar16;
            } while (pmVar16 != (magic_realm *)0x0);
          }
          msg("You can learn %d more %s.",(ulong)(uint)p->upkeep->new_spells,&local_2a8);
        }
        puVar1 = &p->upkeep->redraw;
        *puVar1 = *puVar1 | 0x200800;
      }
    }
  }
  uVar5 = p->upkeep->update;
  if ((uVar5 & 0x20) != 0) {
    p->upkeep->update = uVar5 & 0xffffffdf;
    calc_specialty(p);
  }
  if ((character_generated == true) && (_Var10 = map_is_visible(), _Var10)) {
    uVar5 = p->upkeep->update;
    if ((uVar5 & 0x40) != 0) {
      p->upkeep->update = uVar5 & 0xffffffbf;
      update_view(cave,p);
    }
    uVar5 = p->upkeep->update;
    if ((uVar5 >> 8 & 1) != 0) {
      p->upkeep->update = uVar5 & 0xfffffe7f;
      update_monsters(true);
    }
    uVar5 = p->upkeep->update;
    if ((char)uVar5 < '\0') {
      p->upkeep->update = uVar5 & 0xffffff7f;
      update_monsters(false);
    }
    uVar5 = p->upkeep->update;
    if ((uVar5 >> 9 & 1) != 0) {
      p->upkeep->update = uVar5 & 0xfffffdff;
      event_signal(EVENT_PLAYERMOVED);
    }
  }
  return;
}

Assistant:

void update_stuff(struct player *p)
{
	/* Update stuff */
	if (!p->upkeep->update) return;


	if (p->upkeep->update & (PU_INVEN)) {
		p->upkeep->update &= ~(PU_INVEN);
		calc_inventory(p);
	}

	if (p->upkeep->update & (PU_BONUS)) {
		p->upkeep->update &= ~(PU_BONUS);
		update_bonuses(p);
	}

	if (p->upkeep->update & (PU_TORCH)) {
		p->upkeep->update &= ~(PU_TORCH);
		calc_light(p, &p->state, true);
	}

	if (p->upkeep->update & (PU_HP)) {
		p->upkeep->update &= ~(PU_HP);
		calc_hitpoints(p);
	}

	if (p->upkeep->update & (PU_MANA)) {
		p->upkeep->update &= ~(PU_MANA);
		calc_mana(p, &p->state, true);
	}

	if (p->upkeep->update & (PU_SPELLS)) {
		p->upkeep->update &= ~(PU_SPELLS);
		if (p->class->magic.total_spells > 0) {
			calc_spells(p);
		}
	}

	if (p->upkeep->update & (PU_SPECIALTY)) {
		p->upkeep->update &= ~(PU_SPECIALTY);
		calc_specialty(p);
	}

	/* Character is not ready yet, no map updates */
	if (!character_generated) return;

	/* Map is not shown, no map updates */
	if (!map_is_visible()) return;

	if (p->upkeep->update & (PU_UPDATE_VIEW)) {
		p->upkeep->update &= ~(PU_UPDATE_VIEW);
		update_view(cave, p);
	}

	if (p->upkeep->update & (PU_DISTANCE)) {
		p->upkeep->update &= ~(PU_DISTANCE);
		p->upkeep->update &= ~(PU_MONSTERS);
		update_monsters(true);
	}

	if (p->upkeep->update & (PU_MONSTERS)) {
		p->upkeep->update &= ~(PU_MONSTERS);
		update_monsters(false);
	}


	if (p->upkeep->update & (PU_PANEL)) {
		p->upkeep->update &= ~(PU_PANEL);
		event_signal(EVENT_PLAYERMOVED);
	}
}